

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::javanano::GenerateSetBit_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,int bit_index)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_75;
  allocator local_61;
  undefined1 local_60 [8];
  string mask;
  undefined1 local_38 [4];
  int bit_in_var_index;
  string var_name;
  int bit_index_local;
  string *result;
  
  var_name.field_2._12_4_ = SUB84(this,0);
  GetBitFieldNameForBit_abi_cxx11_
            ((string *)local_38,(javanano *)((ulong)this & 0xffffffff),bit_index);
  mask.field_2._12_4_ = (int)var_name.field_2._12_4_ % 0x20;
  pcVar1 = *(char **)(kBitMasks + (long)(int)mask.field_2._12_4_ * 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_60,pcVar1,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_75 = 0;
  std::operator+(&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 " |= ");
  std::operator+(__return_storage_ptr__,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)&local_98);
  local_75 = 1;
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string GenerateSetBit(int bit_index) {
  string var_name = GetBitFieldNameForBit(bit_index);
  int bit_in_var_index = bit_index % 32;

  string mask = kBitMasks[bit_in_var_index];
  string result = var_name + " |= " + mask;
  return result;
}